

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> __thiscall
cmMakefileTargetGenerator::CreateLinkLineComputer
          (cmMakefileTargetGenerator *this,cmOutputConverter *outputConverter,
          cmStateDirectory *stateDir)

{
  cmMakefile *this_00;
  cmOutputConverter *outputConverter_00;
  bool bVar1;
  undefined8 in_RCX;
  string local_50;
  
  this_00 = (cmMakefile *)(outputConverter->StateSnapshot).Position.Position;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MSVC60","");
  bVar1 = cmMakefile::IsOn(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  outputConverter_00 = *(cmOutputConverter **)&outputConverter[1].LinkScriptShell;
  if (bVar1) {
    cmGlobalGenerator::CreateMSVC60LinkLineComputer
              ((cmGlobalGenerator *)this,outputConverter_00,stateDir);
  }
  else {
    (*(code *)(((outputConverter_00->StateSnapshot).State)->ScriptedCommands)._M_h._M_buckets)
              (this,outputConverter_00,stateDir,in_RCX);
  }
  return (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmLinkLineComputer>
cmMakefileTargetGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter, cmStateDirectory const& stateDir)
{
  if (this->Makefile->IsOn("MSVC60")) {
    return this->GlobalGenerator->CreateMSVC60LinkLineComputer(outputConverter,
                                                               stateDir);
  }
  return this->GlobalGenerator->CreateLinkLineComputer(outputConverter,
                                                       stateDir);
}